

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plurrule.cpp
# Opt level: O3

RuleChain * __thiscall
icu_63::PluralRules::rulesForKeyword(PluralRules *this,UnicodeString *keyword)

{
  ushort uVar1;
  short sVar2;
  RuleChain *pRVar3;
  UBool UVar4;
  int iVar5;
  int32_t len;
  bool bVar6;
  
  pRVar3 = this->mRules;
  do {
    if (pRVar3 == (RuleChain *)0x0) {
      return (RuleChain *)0x0;
    }
    uVar1 = (pRVar3->fKeyword).fUnion.fStackFields.fLengthAndFlags;
    if ((uVar1 & 1) == 0) {
      if ((short)uVar1 < 0) {
        len = (pRVar3->fKeyword).fUnion.fFields.fLength;
      }
      else {
        len = (int)(short)uVar1 >> 5;
      }
      sVar2 = (keyword->fUnion).fStackFields.fLengthAndFlags;
      if (sVar2 < 0) {
        iVar5 = (keyword->fUnion).fFields.fLength;
      }
      else {
        iVar5 = (int)sVar2 >> 5;
      }
      if ((((int)sVar2 & 1U) == 0) && (len == iVar5)) {
        UVar4 = UnicodeString::doEquals(&pRVar3->fKeyword,keyword,len);
        bVar6 = UVar4 != '\0';
        goto LAB_0026db42;
      }
    }
    else {
      bVar6 = (bool)(*(byte *)&keyword->fUnion & 1);
LAB_0026db42:
      if (bVar6 != false) {
        return pRVar3;
      }
    }
    pRVar3 = pRVar3->fNext;
  } while( true );
}

Assistant:

RuleChain *PluralRules::rulesForKeyword(const UnicodeString &keyword) const {
    RuleChain *rc;
    for (rc = mRules; rc != nullptr; rc = rc->fNext) {
        if (rc->fKeyword == keyword) {
            break;
        }
    }
    return rc;
}